

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O3

bool __thiscall
lan::db::append<bool>(db *this,db_bit *context,string *name,bool value,db_bit_type type)

{
  pointer pcVar1;
  bool bVar2;
  db_bits *in_RAX;
  db_bit *pdVar3;
  db_bit *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  this->data = context;
  if ((context->type == Container) &&
     (pdVar3 = context->lin, this->data = pdVar3, pdVar3 != (db_bit *)0x0)) {
    pdVar3 = get_last_bit(this,in_RAX);
    this->data = pdVar3;
    this_00 = (db_bit *)operator_new(0x50);
    (this_00->key)._M_dataplus._M_p = (pointer)&(this_00->key).field_2;
    (this_00->key)._M_string_length = 0;
    (this_00->key).field_2._M_local_buf[0] = '\0';
    this_00->data = (void *)0x0;
    this_00->pre = (db_bit *)0x0;
    this_00->nex = (db_bit *)0x0;
    this_00->lin = (db_bit *)0x0;
    this_00->con = (db_bit *)0x0;
    pdVar3->nex = this_00;
    this_00->pre = pdVar3;
    this->data = this_00;
    if ((int)type < 9) {
      paVar4 = &local_50.field_2;
      pcVar1 = (name->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
      bVar2 = set_bit<bool>(this,context,this_00,&local_50,type,value);
      _Var5._M_p = local_50._M_dataplus._M_p;
    }
    else {
      paVar4 = &local_60;
      pcVar1 = (name->_M_dataplus)._M_p;
      local_70[0] = paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar1,pcVar1 + name->_M_string_length);
      db_bit::~db_bit(this_00);
      std::__cxx11::string::_M_assign((string *)this_00);
      this_00->type = type;
      this_00->con = context;
      bVar2 = true;
      _Var5._M_p = (pointer)local_70[0];
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar4) {
      operator_delete(_Var5._M_p,paVar4->_M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool append(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            if(data-> type == lan::Container and (data = data->lin)){
                data = get_last_bit(data);
                data->nex = new db_bit; data->nex->pre = data; data = data->nex;
                return ((type < lan::Array) ? set_bit(context, data, name, type, value) : set_bit(context, data, name, type));
            } return false;
        }